

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall IMLE<1,_1,_FastLinearExpert>::EM(IMLE<1,_1,_FastLinearExpert> *this,Z *z,X *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer pFVar5;
  pointer pFVar6;
  pointer pFVar7;
  iterator it;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar13;
  undefined1 auVar12 [16];
  double dVar14;
  double dVar15;
  FastLinearExpert<1,_1> local_1d0;
  
  pFVar7 = (this->experts).
           super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           .
           super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar5 = (this->experts).
           super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           .
           super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar7 < pFVar5) {
    dVar11 = 0.0;
    pFVar6 = pFVar7;
    do {
      dVar11 = dVar11 + (pFVar6->super_LinearExpert<1,_1>).h;
      pFVar6 = pFVar6 + 1;
    } while (pFVar6 < pFVar5);
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      if ((this->param).accelerated == false) {
        for (; pFVar7 < pFVar5; pFVar7 = pFVar7 + 1) {
          FastLinearExpert<1,_1>::e_step(pFVar7,z,x,(pFVar7->super_LinearExpert<1,_1>).h / dVar11);
          FastLinearExpert<1,_1>::m_step(pFVar7);
          pFVar5 = (this->experts).
                   super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                   .
                   super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      else if (pFVar7 < pFVar5) {
        do {
          dVar13 = (pFVar7->super_LinearExpert<1,_1>).h / dVar11;
          if (0.001 < dVar13) {
            FastLinearExpert<1,_1>::e_step(pFVar7,z,x,dVar13);
            FastLinearExpert<1,_1>::m_step(pFVar7);
            pFVar5 = (this->experts).
                     super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                     .
                     super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          pFVar7 = pFVar7 + 1;
        } while (pFVar7 < pFVar5);
      }
      goto LAB_00143aa3;
    }
  }
  FastLinearExpert<1,_1>::FastLinearExpert(&local_1d0,z,x,this);
  std::
  vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>::
  push_back(&(this->experts).
             super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
            ,&local_1d0);
  FastLinearExpert<1,_1>::e_step
            ((this->experts).
             super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             .
             super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1,z,x,1.0);
  FastLinearExpert<1,_1>::m_step
            ((this->experts).
             super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             .
             super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  this->M = (int)((ulong)((long)(this->experts).
                                super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                                .
                                super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->experts).
                               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               .
                               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x73ecade3;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"e_step: sum_h = 0.0! (Should not happen)",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  pFVar5 = (this->experts).
           super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           .
           super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_00143aa3:
  dVar11 = (this->zeroZ).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
           m_data.array[0];
  dVar13 = (this->zeroX).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
           m_data.array[0];
  for (pFVar7 = (this->experts).
                super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                .
                super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar7 < pFVar5; pFVar7 = pFVar7 + 1) {
    dVar11 = dVar11 + (pFVar7->super_LinearExpert<1,_1>).invSigma.
                      super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
                      array[0];
    dVar13 = dVar13 + (pFVar7->super_LinearExpert<1,_1>).invPsi.
                      super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
                      array[0];
  }
  dVar1 = (this->param).wSigma;
  dVar2 = (this->param).wPsi;
  dVar3 = (this->param).wsigma;
  dVar4 = (this->param).wpsi;
  dVar14 = ((double)this->M * dVar1 - dVar3) * 0.5 + -1.0;
  dVar15 = ((double)this->M * dVar2 - dVar4) * 0.5 + -1.0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar14 * dVar14 + dVar1 * dVar3 * (this->param).sigma0 * dVar11;
  auVar9 = sqrtpd(auVar8,auVar8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       dVar15 * dVar15 +
       dVar13 * dVar4 * dVar2 *
                (this->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                m_storage.m_data.array[0];
  auVar8 = sqrtpd(auVar12,auVar12);
  auVar10._0_8_ = auVar9._0_8_ + dVar14;
  auVar10._8_8_ = auVar8._0_8_ + dVar15;
  auVar9._8_8_ = dVar2 * dVar13;
  auVar9._0_8_ = dVar1 * dVar11;
  auVar9 = divpd(auVar10,auVar9);
  this->Sigma = (Z)auVar9._0_8_;
  this->Psi = (X)auVar9._8_8_;
  dVar11 = this->sig_level_noiseX_rbf;
  dVar13 = auVar9._8_8_;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  this->pNoiseModelX = dVar11 / dVar13;
  dVar11 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
           m_data.array[0];
  dVar13 = this->sig_level_noiseZ_rbf;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  this->pNoiseModelZ = dVar13 / dVar11;
  dVar13 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data
           .array[0] *
           (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
           m_data.array[0];
  dVar11 = this->sig_level_noiseZX_rbf;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  this->pNoiseModelZX = dVar11 / dVar13;
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::EM(Z const &z, X const &x)
{
    // Expectation Step
    Scal h, sum_h = 0.0;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        sum_h += it->get_h();

    if( sum_h == 0.0)
    {
        // Create new linear expert
#ifdef IMLE_NO_TEMPLATES
        experts.push_back( Expert(d,D,z,x,this) );
#else
        experts.push_back( Expert(z,x,this) );
#endif
        experts.back().e_step(z,x,1.0);
        experts.back().m_step();
        M = experts.size();
        std::cout << "e_step: sum_h = 0.0! (Should not happen)" << std::endl;
    }
    else if( param.accelerated )
        for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        {
            if( (h = it->get_h()/sum_h) > 0.001 )
            {
                it->e_step( z, x, h );
                it->m_step();
            }

        }
    else
        for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        {
            it->e_step( z, x, it->get_h()/sum_h );
            it->m_step();
        }

    // Maximization Step
    //
    Z sum_diagSigma = zeroZ;
    X sum_diagPsi = zeroX;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
    {
        sum_diagSigma += it->invSigma.diagonal();
        sum_diagPsi += it->invPsi;
    }

    // Update common inverse-Wishart prior on Sigma
    Scal tmp = (M*param.wSigma - param.wsigma)/2.0 - 1.0;
    Sigma = param.wSigma * param.wsigma * param.sigma0 * sum_diagSigma;
    Sigma.array() += tmp*tmp;
    Sigma.array() = (Sigma.array().sqrt() + tmp) / (param.wSigma * sum_diagSigma.array());

    // Update common inverse-gamma prior on Psi
    tmp = (M*param.wPsi - param.wpsi)/2.0 - 1.0;
    Psi.array() = (param.wPsi * param.wpsi) * param.Psi0.array() * sum_diagPsi.array();
    Psi.array() += tmp*tmp;
    Psi.array() = (Psi.array().sqrt() + tmp) / (param.wPsi * sum_diagPsi.array());

    // Update outlier model
    pNoiseModelX = sig_level_noiseX_rbf / sqrt(Psi.prod());
    pNoiseModelZ = sig_level_noiseZ_rbf / sqrt(Sigma.prod());
    pNoiseModelZX = sig_level_noiseZX_rbf / sqrt(Psi.prod() * Sigma.prod());
}